

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharBitvec::ToComplement<char16_t>
          (CharBitvec *this,ArenaAllocator *allocator,uint base,CharSet<char16_t> *result)

{
  code *pcVar1;
  bool bVar2;
  Char lc;
  Char hc;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  
  iVar4 = -1;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    iVar3 = NextClear(this,iVar4 + 1);
    if (iVar3 < 0) {
      return;
    }
    iVar4 = NextSet(this,iVar3 + 1);
    if (iVar4 < 0) {
      iVar4 = 0xff;
    }
    else {
      if (iVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0x91,"(hi > 0)","hi > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      iVar4 = iVar4 + -1;
    }
    lc = Chars<char16_t>::ITC(iVar3 + base);
    hc = Chars<char16_t>::ITC(base + iVar4);
    CharSet<char16_t>::SetRange(result,allocator,lc,hc);
  } while( true );
}

Assistant:

void CharBitvec::ToComplement(ArenaAllocator* allocator, uint base, CharSet<C>& result) const
    {
        int hi = -1;
        while (true)
        {
            // Find the next range of clear bits in vector
            int li = NextClear(hi + 1);
            if (li < 0)
                return;
            hi = NextSet(li + 1);
            if (hi < 0)
                hi = Size - 1;
            else
            {
                Assert(hi > 0);
                hi--;
            }

            // Add range as characters
            result.SetRange(allocator, Chars<C>::ITC(base + li), Chars<C>::ITC(base + hi));
        }
    }